

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::StringLifting::run::StringApplier::create(StringApplier *this)

{
  undefined1 local_20 [16];
  StringApplier *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::StringLifting::run(wasm::Module*)::StringApplier,wasm::StringLifting_const&>
            ((StringLifting *)local_20);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::StringLifting::run(wasm::Module*)::StringApplier,std::default_delete<wasm::StringLifting::run(wasm::Module*)::StringApplier>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<StringApplier,_std::default_delete<StringApplier>_> *)local_20);
  std::unique_ptr<StringApplier,_std::default_delete<StringApplier>_>::~unique_ptr
            ((unique_ptr<StringApplier,_std::default_delete<StringApplier>_> *)local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<StringApplier>(parent);
      }